

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O3

void Kit_TruthCountOnesInCofs_64bit(word *pTruth,int nVars,int *pStore)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  undefined1 auVar16 [16];
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  ulong uVar20;
  
  uVar7 = 1 << ((byte)(nVars + -6) & 0x1f);
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 7) {
    if (0 < nVars) {
      uVar2 = *pTruth;
      uVar3 = (uVar2 >> 2 & 0x1111111111111111) + (uVar2 & 0x1111111111111111);
      uVar3 = (uVar3 >> 4) + uVar3 & 0x707070707070707;
      uVar3 = (uVar3 >> 8) + uVar3;
      lVar4 = (uVar3 >> 0x10) + uVar3;
      *pStore = (int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xff;
      if (nVars != 1) {
        uVar3 = uVar2 >> 1;
        uVar5 = (uVar2 & 0x3333333333333333) - (uVar3 & 0x1111111111111111);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar4 = (uVar5 >> 0x10) + uVar5;
        pStore[1] = (int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xff;
        if ((((2 < (uint)nVars) &&
             (uVar5 = (uVar2 & 0xf0f0f0f0f0f0f0f) - (uVar3 & 0x505050505050505),
             uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
             uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f, uVar5 = (uVar5 >> 8) + uVar5,
             lVar4 = (uVar5 >> 0x10) + uVar5,
             pStore[2] = (int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xff, nVars != 3)) &&
            (uVar5 = (uVar2 & 0xff00ff00ff00ff) - (uVar3 & 0x55005500550055),
            uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
            uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f, uVar5 = (uVar5 >> 8) + uVar5,
            lVar4 = (uVar5 >> 0x10) + uVar5,
            pStore[3] = (int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xff, 4 < (uint)nVars)) &&
           (uVar5 = (uVar2 & 0xffff0000ffff) - (uVar3 & 0x555500005555),
           uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
           uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f, uVar5 = (uVar5 >> 8) + uVar5,
           lVar4 = (uVar5 >> 0x10) + uVar5,
           pStore[4] = (int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xff, nVars == 6)) {
          uVar2 = (uVar2 & 0xffffffff) - (ulong)((uint)uVar3 & 0x55555555);
          uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
          uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
          uVar2 = (uVar2 >> 8) + uVar2;
          lVar4 = (uVar2 >> 0x10) + uVar2;
          pStore[5] = (int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xff;
        }
      }
    }
  }
  else if (nVars + -6 != 0x1f) {
    uVar2 = 0;
    do {
      uVar3 = pTruth[uVar2] - (pTruth[uVar2] >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
      uVar3 = (uVar3 >> 8) + uVar3;
      lVar4 = (uVar3 >> 0x10) + uVar3;
      lVar6 = 0;
      do {
        if (((uint)uVar2 >> ((uint)lVar6 & 0x1f) & 1) == 0) {
          pStore[lVar6 + 6] = pStore[lVar6 + 6] + ((int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xffU)
          ;
        }
        lVar6 = lVar6 + 1;
      } while ((ulong)(uint)nVars - 6 != lVar6);
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar7);
    if (1 < (int)uVar7) {
      iVar8 = *pStore;
      iVar9 = pStore[1];
      iVar10 = pStore[2];
      iVar11 = pStore[3];
      iVar12 = pStore[4];
      iVar13 = pStore[5];
      uVar7 = (uVar7 >> 1) + 1;
      do {
        auVar1 = *(undefined1 (*) [16])pTruth;
        auVar14._0_8_ = auVar1._0_8_;
        auVar14._8_4_ = auVar1._0_4_;
        auVar14._12_4_ = auVar1._4_4_;
        uVar15 = auVar1._8_8_;
        auVar19._0_8_ = uVar15 * 2 & 0xaaaaaaaaaaaaaaaa;
        auVar19._8_4_ = (uint)(uVar15 << 2) & 0xcccccccc;
        auVar19._12_4_ = (uint)((uVar15 << 2) >> 0x20) & 0xcccccccc;
        auVar19 = auVar19 | auVar14 & _DAT_00953170;
        uVar2 = auVar19._8_8_;
        uVar3 = auVar19._0_8_ - (uVar15 & 0x5555555555555555);
        uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
        uVar18 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
        uVar20 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
        auVar16._0_8_ = (uVar15 & 0xf0f0f0f0f0f0f0f) << 4;
        auVar16._8_4_ = (uint)(uVar15 << 8) & 0xff00ff00;
        auVar16._12_4_ = auVar1._11_4_ & 0xff00ff00;
        auVar16 = auVar16 | auVar14 & _DAT_00953190;
        uVar2 = auVar16._0_8_;
        uVar3 = auVar16._8_8_;
        uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
        uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
        uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
        uVar5 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
        uVar3 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
        uVar17 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar2 = (uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f;
        uVar3 = (uVar3 >> 8) + uVar3;
        uVar17 = (uVar17 >> 8) + uVar17;
        uVar2 = (uVar2 >> 8) + uVar2;
        uVar5 = (uVar5 >> 8) + uVar5;
        uVar3 = (uVar3 >> 0x10) + uVar3;
        uVar17 = (uVar17 >> 0x10) + uVar17;
        uVar2 = (uVar2 >> 0x10) + uVar2;
        uVar5 = (uVar5 >> 0x10) + uVar5;
        iVar8 = iVar8 + ((uint)((uVar2 >> 0x20) + uVar2) & 0xff);
        iVar9 = iVar9 + ((uint)((uVar5 >> 0x20) + uVar5) & 0xff);
        iVar10 = iVar10 + ((uint)((uVar3 >> 0x20) + uVar3) & 0xff);
        iVar11 = iVar11 + ((uint)((uVar17 >> 0x20) + uVar17) & 0xff);
        uVar2 = auVar14._0_8_ & 0xffff0000ffff |
                *(long *)(*(undefined1 (*) [16])pTruth + 8) * 0x10000 & 0xffff0000ffff0000U;
        uVar3 = uVar15 << 0x20 | auVar14._8_8_ & 0xffffffff;
        uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
        uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
        uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
        uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
        uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
        uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
        uVar2 = (uVar2 >> 8) + uVar2;
        uVar3 = (uVar3 >> 8) + uVar3;
        uVar2 = (uVar2 >> 0x10) + uVar2;
        uVar3 = (uVar3 >> 0x10) + uVar3;
        iVar12 = iVar12 + ((uint)((uVar2 >> 0x20) + uVar2) & 0xff);
        iVar13 = iVar13 + ((uint)((uVar3 >> 0x20) + uVar3) & 0xff);
        pTruth = (word *)((long)pTruth + 0x10);
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
      *pStore = iVar8;
      pStore[1] = iVar9;
      pStore[2] = iVar10;
      pStore[3] = iVar11;
      pStore[4] = iVar12;
      pStore[5] = iVar13;
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs_64bit( word * pTruth, int nVars, int * pStore )
{    
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 6 )
    {
        if ( nVars > 0 )        
            pStore[0] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x5555555555555555) );  
        if ( nVars > 1 )       
            pStore[1] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x3333333333333333) );     
        if ( nVars > 2 )       
            pStore[2] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F) );   
        if ( nVars > 3 )       
            pStore[3] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF) );     
        if ( nVars > 4 )       
            pStore[4] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF) ); 
        if ( nVars > 5 )       
            pStore[5] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00000000FFFFFFFF) );      
        return;
    }
    // nVars > 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes_64bit( pTruth[k] );
        for ( i = 6; i < nVars; i++ )
            if ( (k & (1 << (i-6))) == 0)
                pStore[i] += Counter;
    }
    // count 1's for the first six variables
    for ( k = nWords/2; k>0; k-- )
    {
        pStore[0] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x5555555555555555)) | ((pTruth[1] & ABC_CONST(0x5555555555555555)) <<  1) );
        pStore[1] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x3333333333333333)) | ((pTruth[1] & ABC_CONST(0x3333333333333333)) <<  2) );
        pStore[2] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) | ((pTruth[1] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) <<  4) );
        pStore[3] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF)) | ((pTruth[1] & ABC_CONST(0x00FF00FF00FF00FF)) <<  8) );
        pStore[4] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF)) | ((pTruth[1] & ABC_CONST(0x0000FFFF0000FFFF)) <<  16) );
        pStore[5] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00000000FFFFFFFF)) | ((pTruth[1] & ABC_CONST(0x00000000FFFFFFFF)) <<  32) );  
        pTruth += 2;
    }
}